

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O1

int fiobj_iseq(FIOBJ o,FIOBJ o2)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  
  if (o != o2) {
    if (o2 == 0) {
      return 0;
    }
    if ((~(uint)o2 & 6) == 0) {
      return 0;
    }
    uVar2 = (uint)o;
    uVar6 = uVar2 & 6;
    if (uVar6 == 6) {
      return 0;
    }
    if ((((uint)o2 | uVar2) & 1) != 0) {
      return 0;
    }
    bVar1 = *(byte *)(o & 0xfffffffffffffff8);
    if (bVar1 != *(byte *)(o2 & 0xfffffffffffffff8)) {
      return 0;
    }
    uVar5 = 1;
    if ((o & 1) == 0) {
      switch(uVar6) {
      case 0:
        uVar5 = (uint)bVar1;
        break;
      case 2:
        uVar5 = 0x168b28;
        break;
      case 4:
        uVar5 = 0x168b2a;
        break;
      case 6:
        uVar5 = uVar2;
      }
    }
    uVar2 = (uVar5 & 0xff) - 0x27;
    if (uVar2 < 5) {
      iVar3 = (*(code *)(&DAT_00168b8c + *(int *)(&DAT_00168b8c + (ulong)uVar2 * 4)))();
      return iVar3;
    }
    sVar4 = fiobj_i_is_eq(o,o2);
    if (sVar4 == 0) {
      return 0;
    }
    bVar1 = 1;
    if ((o & 1) == 0) {
      switch(uVar6) {
      case 0:
        bVar1 = *(byte *)(o & 0xfffffffffffffff8);
        break;
      case 2:
        bVar1 = 0x28;
        break;
      case 4:
        bVar1 = 0x2a;
        break;
      case 6:
        bVar1 = (byte)o;
      }
    }
    if (bVar1 - 0x27 < 5) {
      iVar3 = (*(code *)(&DAT_00168bbc + *(int *)(&DAT_00168bbc + (ulong)(bVar1 - 0x27) * 4)))();
      return iVar3;
    }
  }
  return 1;
}

Assistant:

FIO_INLINE int fiobj_iseq(const FIOBJ o, const FIOBJ o2) {
  if (o == o2)
    return 1;
  if (!o || !o2)
    return 0; /* they should have compared equal before. */
  if (!FIOBJ_IS_ALLOCATED(o) || !FIOBJ_IS_ALLOCATED(o2))
    return 0; /* they should have compared equal before. */
  if (FIOBJECT2HEAD(o)->type != FIOBJECT2HEAD(o2)->type)
    return 0; /* non-type equality is a barriar to equality. */
  if (!FIOBJECT2VTBL(o)->is_eq(o, o2))
    return 0;
  if (FIOBJECT2VTBL(o)->each && FIOBJECT2VTBL(o)->count(o))
    return fiobj_iseq____internal_complex__((FIOBJ)o, (FIOBJ)o2);
  return 1;
}